

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1352d2::ClangShellCommand::configureAttribute
          (ClangShellCommand *this,ConfigureContext *ctx,StringRef name,
          ArrayRef<llvm::StringRef> values)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  StringRef *pSVar5;
  iterator __begin3;
  StringRef local_38;
  
  pSVar5 = values.Data;
  if ((name.Length == 4) && (*(int *)name.Data == 0x73677261)) {
    pSVar1 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish != pSVar1) {
      (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar1;
    }
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::reserve
              (&this->args,values.Length);
    for (lVar4 = values.Length << 4; lVar4 != 0; lVar4 = lVar4 + -0x10) {
      iVar3 = (*ctx->delegate->_vptr_BuildFileDelegate[2])
                        (ctx->delegate,pSVar5->Data,pSVar5->Length);
      local_38.Data = (char *)CONCAT44(extraout_var,iVar3);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
                (&this->args,&local_38);
      pSVar5 = pSVar5 + 1;
    }
    return true;
  }
  bVar2 = llbuild::buildsystem::ExternalCommand::configureAttribute
                    (&this->super_ExternalCommand,ctx,name,values);
  return bVar2;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  ArrayRef<StringRef> values) override {
    if (name == "args") {
      args.clear();
      args.reserve(values.size());
      for (auto arg: values) {
        args.emplace_back(ctx.getDelegate().getInternedString(arg));
      }
    } else {
        return ExternalCommand::configureAttribute(ctx, name, values);
    }

    return true;
  }